

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

Value * __thiscall
kj::_::Debug::
ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++:1086:5)>
::evaluate(Value *__return_storage_ptr__,
          ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_test_c__:1086:5)>
          *this)

{
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  makeDescription<unsigned_int&>((char *)&local_28,(StringPtr *)"step");
  __return_storage_ptr__->file =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
  ;
  __return_storage_ptr__->line[0] = '>';
  __return_storage_ptr__->line[1] = '\x04';
  __return_storage_ptr__->line[2] = '\0';
  __return_storage_ptr__->line[3] = '\0';
  __return_storage_ptr__->description[0] = (undefined1)local_28;
  __return_storage_ptr__->description[1] = local_28._1_1_;
  __return_storage_ptr__->description[2] = local_28._2_1_;
  __return_storage_ptr__->description[3] = local_28._3_1_;
  __return_storage_ptr__->description[4] = local_28._4_1_;
  __return_storage_ptr__->description[5] = local_28._5_1_;
  __return_storage_ptr__->description[6] = local_28._6_1_;
  __return_storage_ptr__->field_0x17 = local_28._7_1_;
  *(undefined8 *)&__return_storage_ptr__->field_0x18 = local_20;
  *(undefined8 *)&__return_storage_ptr__->field_0x20 = local_18;
  return __return_storage_ptr__;
}

Assistant:

Value evaluate() override {
      return func();
    }